

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O2

string * FormatFullVersion_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_,
                 "v28.99.0-36ad9516dbd6",&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)in_RDI,&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatFullVersion()
{
    static const std::string CLIENT_BUILD(BUILD_DESC BUILD_SUFFIX);
    return CLIENT_BUILD;
}